

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateYield(ExpressionTranslateContext *ctx,ExprYield *expression)

{
  bool bVar1;
  ExprSequence *local_20;
  ExprSequence *closures;
  ExprYield *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
  }
  local_20 = getType<ExprSequence>(expression->closures);
  if ((local_20 != (ExprSequence *)0x0) &&
     (bVar1 = SmallArray<ExprBase_*,_4U>::empty(&local_20->expressions), bVar1)) {
    local_20 = (ExprSequence *)0x0;
  }
  if (expression->value->type == ctx->ctx->typeVoid) {
    if (local_20 != (ExprSequence *)0x0) {
      Translate(ctx,expression->closures);
      Print(ctx,";");
      PrintLine(ctx);
      PrintIndent(ctx);
    }
    Translate(ctx,expression->value);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Print(ctx,"return;");
  }
  else if (local_20 == (ExprSequence *)0x0) {
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    Print(ctx,";");
  }
  else {
    Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
    Translate(ctx,expression->value);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Translate(ctx,expression->closures);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
  }
  PrintLine(ctx);
  ctx->currentFunction->nextTranslateRestoreBlock =
       ctx->currentFunction->nextTranslateRestoreBlock + 1;
  Print(ctx,"yield_%d:");
  return;
}

Assistant:

void TranslateYield(ExpressionTranslateContext &ctx, ExprYield *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(expression->value->type == ctx.ctx.typeVoid)
	{
		if(closures)
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}

		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return;");
	}
	else if(closures)
	{
		Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
	}
	else
	{
		Print(ctx, "return ");
		Translate(ctx, expression->value);
		Print(ctx, ";");
	}

	PrintLine(ctx);

	Print(ctx, "yield_%d:", ctx.currentFunction->nextTranslateRestoreBlock++);
}